

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  uint *puVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  watcher_list *old;
  long *__ptr;
  int iVar12;
  watcher_list *oleft;
  void **ppvVar13;
  
  uVar2 = handle->flags;
  if ((uVar2 >> 0xe & 1) == 0) {
    return -0x16;
  }
  __ptr = (long *)handle->loop->inotify_watchers;
  if (__ptr != (long *)0x0) {
    do {
      if ((int)__ptr[7] <= handle->wd) {
        if (handle->wd <= (int)__ptr[7]) goto LAB_00114476;
        __ptr = __ptr + 1;
      }
      __ptr = (long *)*__ptr;
    } while (__ptr != (long *)0x0);
  }
  __ptr = (long *)0x0;
LAB_00114476:
  if (__ptr == (long *)0x0) {
    __assert_fail("w != NULL","src/unix/linux-inotify.c",0xed,
                  "int uv_fs_event_stop(uv_fs_event_t *)");
  }
  handle->wd = -1;
  handle->filename = (char *)0x0;
  handle->flags = uVar2 & 0xffffbfff;
  if ((uVar2 >> 0xd & 1) != 0) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  *(void **)handle->watchers[1] = handle->watchers[0];
  *(void **)((long)handle->watchers[0] + 8) = handle->watchers[1];
  if (__ptr + 4 != (long *)__ptr[4]) {
    return 0;
  }
  ppvVar8 = &handle->loop->inotify_watchers;
  plVar10 = (long *)__ptr[1];
  plVar9 = plVar10;
  if (((long *)*__ptr == (long *)0x0) || (plVar9 = (long *)*__ptr, plVar10 == (long *)0x0)) {
    plVar10 = (long *)__ptr[2];
    iVar12 = (int)__ptr[3];
    if (plVar9 != (long *)0x0) {
      plVar9[2] = (long)plVar10;
    }
    if (plVar10 == (long *)0x0) {
      *ppvVar8 = plVar9;
      plVar10 = (long *)0x0;
    }
    else if ((long *)*plVar10 == __ptr) {
      *plVar10 = (long)plVar9;
    }
    else {
      plVar10[1] = (long)plVar9;
    }
  }
  else {
    do {
      plVar11 = plVar10;
      plVar10 = (long *)*plVar11;
    } while ((long *)*plVar11 != (long *)0x0);
    plVar9 = (long *)plVar11[1];
    plVar10 = (long *)plVar11[2];
    iVar12 = (int)plVar11[3];
    if (plVar9 != (long *)0x0) {
      plVar9[2] = (long)plVar10;
    }
    ppvVar13 = ppvVar8;
    if (plVar10 != (long *)0x0) {
      ppvVar13 = (void **)(plVar10 + ((long *)*plVar10 != plVar11));
    }
    *ppvVar13 = plVar9;
    if ((long *)plVar11[2] == __ptr) {
      plVar10 = plVar11;
    }
    lVar4 = *__ptr;
    lVar6 = __ptr[1];
    lVar7 = __ptr[3];
    plVar11[2] = __ptr[2];
    plVar11[3] = lVar7;
    *plVar11 = lVar4;
    plVar11[1] = lVar6;
    puVar3 = (undefined8 *)__ptr[2];
    ppvVar13 = ppvVar8;
    if (puVar3 != (undefined8 *)0x0) {
      ppvVar13 = (void **)(puVar3 + ((long *)*puVar3 != __ptr));
    }
    *ppvVar13 = plVar11;
    *(long **)(*__ptr + 0x10) = plVar11;
    if (__ptr[1] != 0) {
      *(long **)(__ptr[1] + 0x10) = plVar11;
    }
  }
  if (iVar12 == 0) {
    do {
      if (((plVar9 != (long *)0x0) && ((int)plVar9[3] != 0)) || (plVar9 == (long *)*ppvVar8))
      goto LAB_00114866;
      plVar11 = (long *)*plVar10;
      if (plVar11 == plVar9) {
        plVar11 = (long *)plVar10[1];
        if ((int)plVar11[3] == 1) {
          *(undefined4 *)(plVar11 + 3) = 0;
          *(undefined4 *)(plVar10 + 3) = 1;
          lVar4 = *plVar11;
          plVar10[1] = lVar4;
          if (lVar4 != 0) {
            *(long **)(lVar4 + 0x10) = plVar10;
          }
          lVar4 = plVar10[2];
          plVar11[2] = lVar4;
          ppvVar13 = ppvVar8;
          if (lVar4 != 0) {
            ppvVar13 = (void **)((undefined8 *)plVar10[2] + (plVar10 != *(long **)plVar10[2]));
          }
          *ppvVar13 = plVar11;
          *plVar11 = (long)plVar10;
          plVar10[2] = (long)plVar11;
          plVar11 = (long *)plVar10[1];
        }
        pvVar5 = (void *)*plVar11;
        if (((pvVar5 != (void *)0x0) && (*(int *)((long)pvVar5 + 0x18) != 0)) ||
           ((plVar11[1] != 0 && (*(int *)(plVar11[1] + 0x18) != 0)))) {
          if ((plVar11[1] == 0) || (*(int *)(plVar11[1] + 0x18) == 0)) {
            if (pvVar5 != (void *)0x0) {
              *(undefined4 *)((long)pvVar5 + 0x18) = 0;
            }
            *(undefined4 *)(plVar11 + 3) = 1;
            lVar4 = *(long *)((long)pvVar5 + 8);
            *plVar11 = lVar4;
            if (lVar4 != 0) {
              *(long **)(lVar4 + 0x10) = plVar11;
            }
            lVar4 = plVar11[2];
            *(long *)((long)pvVar5 + 0x10) = lVar4;
            ppvVar13 = ppvVar8;
            if (lVar4 != 0) {
              ppvVar13 = (void **)((undefined8 *)plVar11[2] + (plVar11 != *(long **)plVar11[2]));
            }
            *ppvVar13 = pvVar5;
            *(long **)((long)pvVar5 + 8) = plVar11;
            plVar11[2] = (long)pvVar5;
            plVar11 = (long *)plVar10[1];
          }
          *(int *)(plVar11 + 3) = (int)plVar10[3];
          *(undefined4 *)(plVar10 + 3) = 0;
          if (plVar11[1] != 0) {
            *(undefined4 *)(plVar11[1] + 0x18) = 0;
          }
          plVar9 = (long *)plVar10[1];
          lVar4 = *plVar9;
          plVar10[1] = lVar4;
          if (lVar4 != 0) {
            *(long **)(lVar4 + 0x10) = plVar10;
          }
          lVar4 = plVar10[2];
          plVar9[2] = lVar4;
          ppvVar13 = ppvVar8;
          if (lVar4 != 0) {
            ppvVar13 = (void **)((undefined8 *)plVar10[2] + (plVar10 != *(long **)plVar10[2]));
          }
          *ppvVar13 = plVar9;
          *plVar9 = (long)plVar10;
          goto LAB_0011485f;
        }
      }
      else {
        if ((int)plVar11[3] == 1) {
          *(undefined4 *)(plVar11 + 3) = 0;
          *(undefined4 *)(plVar10 + 3) = 1;
          lVar4 = plVar11[1];
          *plVar10 = lVar4;
          if (lVar4 != 0) {
            *(long **)(lVar4 + 0x10) = plVar10;
          }
          lVar4 = plVar10[2];
          plVar11[2] = lVar4;
          ppvVar13 = ppvVar8;
          if (lVar4 != 0) {
            ppvVar13 = (void **)((undefined8 *)plVar10[2] + (plVar10 != *(long **)plVar10[2]));
          }
          *ppvVar13 = plVar11;
          plVar11[1] = (long)plVar10;
          plVar10[2] = (long)plVar11;
          plVar11 = (long *)*plVar10;
        }
        lVar4 = *plVar11;
        if (((lVar4 != 0) && (*(int *)(lVar4 + 0x18) != 0)) ||
           ((plVar11[1] != 0 && (*(int *)(plVar11[1] + 0x18) != 0)))) goto LAB_001146e4;
      }
      *(undefined4 *)(plVar11 + 3) = 1;
      plVar9 = plVar10;
      plVar10 = (long *)plVar10[2];
    } while( true );
  }
LAB_00114872:
  uv__inotify_rm_watch(handle->loop->inotify_fd,(int32_t)__ptr[7]);
  free(__ptr);
  return 0;
LAB_001146e4:
  if ((lVar4 == 0) || (*(int *)(lVar4 + 0x18) == 0)) {
    plVar9 = (long *)plVar11[1];
    if (plVar9 != (long *)0x0) {
      *(undefined4 *)(plVar9 + 3) = 0;
    }
    *(undefined4 *)(plVar11 + 3) = 1;
    lVar4 = *plVar9;
    plVar11[1] = lVar4;
    if (lVar4 != 0) {
      *(long **)(lVar4 + 0x10) = plVar11;
    }
    lVar4 = plVar11[2];
    plVar9[2] = lVar4;
    ppvVar13 = ppvVar8;
    if (lVar4 != 0) {
      ppvVar13 = (void **)((undefined8 *)plVar11[2] + (plVar11 != *(long **)plVar11[2]));
    }
    *ppvVar13 = plVar9;
    *plVar9 = (long)plVar11;
    plVar11[2] = (long)plVar9;
    plVar11 = (long *)*plVar10;
  }
  *(int *)(plVar11 + 3) = (int)plVar10[3];
  *(undefined4 *)(plVar10 + 3) = 0;
  if (*plVar11 != 0) {
    *(undefined4 *)(*plVar11 + 0x18) = 0;
  }
  plVar9 = (long *)*plVar10;
  lVar4 = plVar9[1];
  *plVar10 = lVar4;
  if (lVar4 != 0) {
    *(long **)(lVar4 + 0x10) = plVar10;
  }
  lVar4 = plVar10[2];
  plVar9[2] = lVar4;
  ppvVar13 = ppvVar8;
  if (lVar4 != 0) {
    ppvVar13 = (void **)((undefined8 *)plVar10[2] + (plVar10 != *(long **)plVar10[2]));
  }
  *ppvVar13 = plVar9;
  plVar9[1] = (long)plVar10;
LAB_0011485f:
  plVar10[2] = (long)plVar9;
  plVar9 = (long *)*ppvVar8;
LAB_00114866:
  if (plVar9 != (long *)0x0) {
    *(undefined4 *)(plVar9 + 3) = 0;
  }
  goto LAB_00114872;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return -EINVAL;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->filename = NULL;
  uv__handle_stop(handle);
  QUEUE_REMOVE(&handle->watchers);

  if (QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&handle->loop->inotify_watchers), w);
    uv__inotify_rm_watch(handle->loop->inotify_fd, w->wd);
    free(w);
  }

  return 0;
}